

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O0

void __thiscall icu_63::double_conversion::Bignum::AssignUInt16(Bignum *this,uint16_t value)

{
  uint *puVar1;
  uint16_t value_local;
  Bignum *this_local;
  
  Zero(this);
  if (value != 0) {
    EnsureCapacity(this,1);
    puVar1 = Vector<unsigned_int>::operator[](&this->bigits_,0);
    *puVar1 = (uint)value;
    this->used_digits_ = 1;
  }
  return;
}

Assistant:

void Bignum::AssignUInt16(uint16_t value) {
  ASSERT(kBigitSize >= BitSize(value));
  Zero();
  if (value == 0) return;

  EnsureCapacity(1);
  bigits_[0] = value;
  used_digits_ = 1;
}